

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

string * vk::BinaryRegistryDetail::anon_unknown_8::getProgramPath
                   (string *__return_storage_ptr__,string *dirName,deUint32 index)

{
  Hex<8UL> *value;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  FilePath local_78;
  FilePath local_58;
  FilePath local_38;
  ulong local_18;
  
  std::__cxx11::string::string((string *)&local_58,(string *)dirName);
  local_18 = (ulong)index;
  de::toString<tcu::Format::Hex<8ul>>(&sStack_b8,(de *)&local_18,value);
  std::operator+(&local_98,&sStack_b8,".spv");
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::string((string *)&local_78,(string *)&local_98);
  de::FilePath::join(&local_38,&local_58,&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_38.m_path._M_dataplus._M_p,
             (allocator<char> *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string getProgramPath (const std::string& dirName, deUint32 index)
{
	return de::FilePath::join(dirName, getProgramFileName(index)).getPath();
}